

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O0

Var Js::WebAssemblyMemory::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  uint32 initial_00;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  DynamicObject *instance;
  WebAssemblyMemory *pWVar8;
  Var sharedVar;
  bool isShared;
  Var maxVar;
  uint32 local_78;
  bool hasMaximum;
  uint32 maximum;
  uint32 initial;
  Var initVar;
  DynamicObject *memoryDescriptor;
  Var local_50;
  Var newTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x3b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  newTarget = RecyclableObject::GetScriptContext(function);
  bVar2 = Arguments::HasArg((Arguments *)&scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x3e,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_50 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&memoryDescriptor,(Arguments *)&scriptContext);
  Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&memoryDescriptor);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if ((!bVar2) &&
     ((local_50 == (Var)0x0 ||
      (BVar3 = Js::JavascriptOperators::IsUndefinedObject(local_50), BVar3 == 0)))) {
    if (1 < ((uint)scriptContext & 0xffffff)) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      BVar3 = Js::JavascriptOperators::IsObject(pvVar7);
      if (BVar3 != 0) {
        pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
        instance = VarTo<Js::DynamicObject>(pvVar7);
        pvVar7 = Js::JavascriptOperators::OP_GetProperty(instance,0xeb,(ScriptContext *)newTarget);
        BVar3 = Js::JavascriptOperators::IsUndefined(pvVar7);
        if (BVar3 != 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)newTarget,-0x7ff5ec77,L"descriptor.initial");
        }
        initial_00 = WebAssembly::ToNonWrappingUint32(pvVar7,(ScriptContext *)newTarget);
        local_78 = Wasm::Limits::GetMaxMemoryMaximumPages();
        pvVar7 = Js::JavascriptOperators::OP_GetProperty(instance,0xec,(ScriptContext *)newTarget);
        BVar3 = Js::JavascriptOperators::IsUndefined(pvVar7);
        if (BVar3 == 0) {
          local_78 = WebAssembly::ToNonWrappingUint32(pvVar7,(ScriptContext *)newTarget);
        }
        sharedVar._7_1_ = false;
        bVar2 = Wasm::Threads::IsEnabled();
        if (bVar2) {
          pvVar7 = Js::JavascriptOperators::OP_GetProperty(instance,0xed,(ScriptContext *)newTarget)
          ;
          BVar4 = Js::JavascriptOperators::IsUndefined(pvVar7);
          if ((BVar4 == 0) &&
             (sharedVar._7_1_ = JavascriptConversion::ToBool(pvVar7,(ScriptContext *)newTarget),
             BVar3 != 0)) {
            JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5e488,(PCWSTR)0x0);
          }
        }
        pWVar8 = CreateMemoryObject(initial_00,local_78,sharedVar._7_1_,(ScriptContext *)newTarget);
        return pWVar8;
      }
    }
    JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ec71,L"descriptor");
  }
  JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ea00,L"WebAssembly.Memory");
}

Assistant:

Var
WebAssemblyMemory::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

    if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("WebAssembly.Memory"));
    }

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("descriptor"));
    }
    DynamicObject * memoryDescriptor = VarTo<DynamicObject>(args[1]);

    Var initVar = JavascriptOperators::OP_GetProperty(memoryDescriptor, PropertyIds::initial, scriptContext);
    if (Js::JavascriptOperators::IsUndefined(initVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedNumber, _u("descriptor.initial"));
    }
    uint32 initial = WebAssembly::ToNonWrappingUint32(initVar, scriptContext);

    uint32 maximum = Wasm::Limits::GetMaxMemoryMaximumPages();
    bool hasMaximum = false;
    Var maxVar = JavascriptOperators::OP_GetProperty(memoryDescriptor, PropertyIds::maximum, scriptContext);
    if (!Js::JavascriptOperators::IsUndefined(maxVar))
    {
        hasMaximum = true;
        maximum = WebAssembly::ToNonWrappingUint32(maxVar, scriptContext);
    }

    bool isShared = false;
    if (Wasm::Threads::IsEnabled())
    {
        Var sharedVar = JavascriptOperators::OP_GetProperty(memoryDescriptor, PropertyIds::shared, scriptContext);
        if (!Js::JavascriptOperators::IsUndefined(sharedVar))
        {
            isShared = JavascriptConversion::ToBool(sharedVar, scriptContext);
            if (!hasMaximum)
            {
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_SharedNoMaximum);
            }
        }
    }

    return CreateMemoryObject(initial, maximum, isShared, scriptContext);
}